

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void SerializeKeyOrigin<DataStream>(DataStream *s,KeyOriginInfo hd_keypath)

{
  undefined4 *puVar1;
  long in_RSI;
  uint *path;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  undefined4 local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish);
  puVar2 = *(undefined4 **)(in_RSI + 8);
  puVar1 = *(undefined4 **)(in_RSI + 0x10);
  if (puVar2 != puVar1) {
    do {
      local_34 = *puVar2;
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                 (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_34,&local_30);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeKeyOrigin(Stream& s, KeyOriginInfo hd_keypath)
{
    s << hd_keypath.fingerprint;
    for (const auto& path : hd_keypath.path) {
        s << path;
    }
}